

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE qpdf_add_page(qpdf_data qpdf,qpdf_data newpage_qpdf,qpdf_oh newpage,QPDF_BOOL first)

{
  QPDF_ERROR_CODE QVar1;
  QPDFObjectHandle page;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  code *local_28;
  code *local_20;
  
  qpdf_oh_item_internal((qpdf_data)auStack_48,(qpdf_oh)newpage_qpdf);
  local_38._12_4_ = 0;
  local_38._8_4_ = first;
  local_20 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1872:30)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1872:30)>
             ::_M_manager;
  local_38._0_8_ = (element_type *)auStack_48;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)(auStack_48 + 0x10));
  std::_Function_base::~_Function_base((_Function_base *)(auStack_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_add_page(qpdf_data qpdf, qpdf_data newpage_qpdf, qpdf_oh newpage, QPDF_BOOL first)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_add_page");
    auto page = qpdf_oh_item_internal(newpage_qpdf, newpage);
    return trap_errors(qpdf, [&page, first](qpdf_data q) { q->qpdf->addPage(page, first); });
}